

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::setWindowFlags(QMdiSubWindowPrivate *this,WindowFlags windowFlags)

{
  Representation RVar1;
  Representation RVar2;
  QWidget *this_00;
  Data *pDVar3;
  QObject *pQVar4;
  QWidgetData *pQVar5;
  int iVar6;
  int iVar7;
  QFlagsStorage<Qt::WindowType> QVar8;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidgetPrivate::setWindowFlags(&this->super_QWidgetPrivate,windowFlags);
      return;
    }
  }
  else {
    QVar8.i = (uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i | 0x3000;
    if (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i >> 8 & 1) == 0) {
      QVar8.i = (Int)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
    }
    if ((char)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i == '\x03') {
      QVar8.i = (uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i | 0x3000;
    }
    if ((QVar8.i & 0x200f800) == 0) {
      QVar8.i = QVar8.i | 0x800f000;
    }
    else if ((QVar8.i >> 0xb & 1) != 0) {
      QVar8.i = QVar8.i & 0x40800;
    }
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pDVar3 = this->actions[5].wp.d;
    if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
       (pQVar4 = this->actions[5].wp.value, pQVar4 != (QObject *)0x0)) {
      QAction::setChecked(SUB81(pQVar4,0));
    }
    if ((((QVar8.i >> 0xb & 1) != 0) && (pDVar3 = (this->sizeGrip).wp.d, pDVar3 != (Data *)0x0)) &&
       ((pQVar4 = (this->sizeGrip).wp.value, pQVar4 != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0
        && (*(int *)(pDVar3 + 4) != 0)))) {
      (**(code **)(*(long *)pQVar4 + 0x20))();
    }
    QWidgetPrivate::setWindowFlags
              (&this->super_QWidgetPrivate,
               (WindowFlags)
               (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                       super_QFlagsStorage<Qt::WindowType>.i & 0xff ^ 0x7fffffed) & QVar8.i | 0x12))
    ;
    updateGeometryConstraints(this);
    updateActions(this);
    pQVar5 = this_00->data;
    if ((pQVar5->widget_attributes & 0x8000) != 0) {
      iVar6 = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
      iVar7 = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
      RVar1.m_i = (this->internalMinimumSize).wd.m_i;
      RVar2.m_i = (this->internalMinimumSize).ht.m_i;
      if ((iVar6 < RVar1.m_i) || (iVar7 < RVar2.m_i)) {
        if (RVar1.m_i < iVar6) {
          RVar1.m_i = iVar6;
        }
        if (RVar2.m_i < iVar7) {
          RVar2.m_i = iVar7;
        }
        local_30.ht.m_i = RVar2.m_i;
        local_30.wd.m_i = RVar1.m_i;
        QWidget::resize(this_00,&local_30);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setWindowFlags(Qt::WindowFlags windowFlags)
{
    Q_Q(QMdiSubWindow);

    if (!parent) {
        QWidgetPrivate::setWindowFlags(windowFlags);
        return;
    }

    Qt::WindowFlags windowType = windowFlags & Qt::WindowType_Mask;
    if (windowType == Qt::Dialog || windowFlags & Qt::MSWindowsFixedSizeDialogHint)
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint;

    // Set standard flags if none of the customize flags are set
    if (!(windowFlags & CustomizeWindowFlags))
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowMinMaxButtonsHint | Qt::WindowCloseButtonHint;
    else if (windowFlags & Qt::FramelessWindowHint && windowFlags & Qt::WindowStaysOnTopHint)
        windowFlags = Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint;
    else if (windowFlags & Qt::FramelessWindowHint)
        windowFlags = Qt::FramelessWindowHint;

    windowFlags &= ~windowType;
    windowFlags &= ~Qt::WindowFullscreenButtonHint;
    windowFlags |= Qt::SubWindow;

#ifndef QT_NO_ACTION
    if (QAction *stayOnTopAction = actions[QMdiSubWindowPrivate::StayOnTopAction]) {
        if (windowFlags & Qt::WindowStaysOnTopHint)
            stayOnTopAction->setChecked(true);
        else
            stayOnTopAction->setChecked(false);
    }
#endif

#if QT_CONFIG(sizegrip)
    if ((windowFlags & Qt::FramelessWindowHint) && sizeGrip)
        delete sizeGrip;
#endif

    QWidgetPrivate::setWindowFlags(windowFlags);
    updateGeometryConstraints();
    updateActions();
    QSize currentSize = q->size();
    if (q->isVisible() && (currentSize.width() < internalMinimumSize.width()
            || currentSize.height() < internalMinimumSize.height())) {
        q->resize(currentSize.expandedTo(internalMinimumSize));
    }
}